

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O1

void make_intp_array(int **array,int64_t size,int num_values)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  
  if (first_original == '\0') {
    first_original = '\x01';
    original = (int **)malloc(size * 8);
  }
  if (0 < size) {
    lVar3 = 0;
    do {
      piVar1 = (int *)malloc(4);
      original[lVar3] = piVar1;
      array[lVar3] = piVar1;
      lVar2 = lrand48();
      *array[lVar3] = (int)(lVar2 % (long)num_values);
      lVar3 = lVar3 + 1;
    } while (size != lVar3);
  }
  return;
}

Assistant:

void make_intp_array(int **array, int64_t size, int num_values) {
  int64_t i;

  if (first_original == 0) {
    first_original = 1;
    original = malloc(sizeof(int *) * size);
  }

  for (i = 0; i < size; i++) {
    array[i] = original[i] = malloc(sizeof(int));
    *(array[i]) = lrand48() % num_values;
  }
}